

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O0

void __thiscall tst_InsertProxyModel::testCommitSubclass_data(tst_InsertProxyModel *this)

{
  QTestData *pQVar1;
  bool local_9d;
  QFlags<InsertProxyModel::InsertDirection> local_9c;
  QAbstractItemModel *local_98;
  bool local_8d;
  QFlags<InsertProxyModel::InsertDirection> local_8c;
  QAbstractItemModel *local_88;
  bool local_7d;
  QFlags<InsertProxyModel::InsertDirection> local_7c;
  QAbstractItemModel *local_78;
  bool local_6d;
  QFlags<InsertProxyModel::InsertDirection> local_6c;
  QAbstractItemModel *local_68;
  bool local_5d;
  QFlags<InsertProxyModel::InsertDirection> local_5c;
  QAbstractItemModel *local_58;
  bool local_4d;
  QFlags<InsertProxyModel::InsertDirection> local_4c;
  QAbstractItemModel *local_48;
  bool local_3d;
  QFlags<InsertProxyModel::InsertDirection> local_3c;
  QAbstractItemModel *local_38;
  bool local_2d;
  QFlags<InsertProxyModel::InsertDirection> local_2c;
  QAbstractItemModel *local_28;
  bool local_1d;
  QFlags<InsertProxyModel::InsertDirection> local_1c;
  QAbstractItemModel *local_18;
  tst_InsertProxyModel *local_10;
  tst_InsertProxyModel *this_local;
  
  local_10 = this;
  QTest::addColumn<QAbstractItemModel*>("baseModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QFlags<InsertProxyModel::InsertDirection>>
            ("insertDirection",(QFlags<InsertProxyModel::InsertDirection> *)0x0);
  QTest::addColumn<bool>("canInsertColumns",(bool *)0x0);
  pQVar1 = (QTestData *)QTest::newRow("List Row");
  local_18 = createListModel(&this->super_QObject);
  pQVar1 = ::operator<<(pQVar1,&local_18);
  QFlags<InsertProxyModel::InsertDirection>::QFlags(&local_1c,InsertRow);
  pQVar1 = ::operator<<(pQVar1,&local_1c);
  local_1d = false;
  ::operator<<(pQVar1,&local_1d);
  pQVar1 = (QTestData *)QTest::newRow("List Column");
  local_28 = createListModel(&this->super_QObject);
  pQVar1 = ::operator<<(pQVar1,&local_28);
  QFlags<InsertProxyModel::InsertDirection>::QFlags(&local_2c,InsertColumn);
  pQVar1 = ::operator<<(pQVar1,&local_2c);
  local_2d = false;
  ::operator<<(pQVar1,&local_2d);
  pQVar1 = (QTestData *)QTest::newRow("List Row Column");
  local_38 = createListModel(&this->super_QObject);
  pQVar1 = ::operator<<(pQVar1,&local_38);
  local_3c = operator|(InsertRow,InsertColumn);
  pQVar1 = ::operator<<(pQVar1,&local_3c);
  local_3d = false;
  ::operator<<(pQVar1,&local_3d);
  pQVar1 = (QTestData *)QTest::newRow("Table Row");
  local_48 = createTableModel(&this->super_QObject);
  pQVar1 = ::operator<<(pQVar1,&local_48);
  QFlags<InsertProxyModel::InsertDirection>::QFlags(&local_4c,InsertRow);
  pQVar1 = ::operator<<(pQVar1,&local_4c);
  local_4d = true;
  ::operator<<(pQVar1,&local_4d);
  pQVar1 = (QTestData *)QTest::newRow("Table Column");
  local_58 = createTableModel(&this->super_QObject);
  pQVar1 = ::operator<<(pQVar1,&local_58);
  QFlags<InsertProxyModel::InsertDirection>::QFlags(&local_5c,InsertColumn);
  pQVar1 = ::operator<<(pQVar1,&local_5c);
  local_5d = true;
  ::operator<<(pQVar1,&local_5d);
  pQVar1 = (QTestData *)QTest::newRow("Table Row Column");
  local_68 = createTableModel(&this->super_QObject);
  pQVar1 = ::operator<<(pQVar1,&local_68);
  local_6c = operator|(InsertRow,InsertColumn);
  pQVar1 = ::operator<<(pQVar1,&local_6c);
  local_6d = true;
  ::operator<<(pQVar1,&local_6d);
  pQVar1 = (QTestData *)QTest::newRow("Tree Row");
  local_78 = createTreeModel(&this->super_QObject);
  pQVar1 = ::operator<<(pQVar1,&local_78);
  QFlags<InsertProxyModel::InsertDirection>::QFlags(&local_7c,InsertRow);
  pQVar1 = ::operator<<(pQVar1,&local_7c);
  local_7d = true;
  ::operator<<(pQVar1,&local_7d);
  pQVar1 = (QTestData *)QTest::newRow("Tree Column");
  local_88 = createTreeModel(&this->super_QObject);
  pQVar1 = ::operator<<(pQVar1,&local_88);
  QFlags<InsertProxyModel::InsertDirection>::QFlags(&local_8c,InsertColumn);
  pQVar1 = ::operator<<(pQVar1,&local_8c);
  local_8d = true;
  ::operator<<(pQVar1,&local_8d);
  pQVar1 = (QTestData *)QTest::newRow("Tree Row Column");
  local_98 = createTreeModel(&this->super_QObject);
  pQVar1 = ::operator<<(pQVar1,&local_98);
  local_9c = operator|(InsertRow,InsertColumn);
  pQVar1 = ::operator<<(pQVar1,&local_9c);
  local_9d = true;
  ::operator<<(pQVar1,&local_9d);
  return;
}

Assistant:

void tst_InsertProxyModel::testCommitSubclass_data()
{
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<InsertProxyModel::InsertDirections>("insertDirection");
    QTest::addColumn<bool>("canInsertColumns");

    QTest::newRow("List Row") << createListModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertRow) << false;
    QTest::newRow("List Column") << createListModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertColumn) << false;
    QTest::newRow("List Row Column") << createListModel(this) << (InsertProxyModel::InsertRow | InsertProxyModel::InsertColumn) << false;
    QTest::newRow("Table Row") << createTableModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertRow) << true;
    QTest::newRow("Table Column") << createTableModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertColumn) << true;
    QTest::newRow("Table Row Column") << createTableModel(this) << (InsertProxyModel::InsertRow | InsertProxyModel::InsertColumn) << true;
    QTest::newRow("Tree Row") << createTreeModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertRow) << true;
    QTest::newRow("Tree Column") << createTreeModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertColumn) << true;
    QTest::newRow("Tree Row Column") << createTreeModel(this) << (InsertProxyModel::InsertRow | InsertProxyModel::InsertColumn) << true;
}